

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxFRandom::FxFRandom
          (FxFRandom *this,FRandom *r,FxExpression *mi,FxExpression *ma,FScriptPosition *pos)

{
  PInt *pPVar1;
  FxExpression *pFVar2;
  PType *pPVar3;
  
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxRandom).super_FxExpression.ScriptPosition,pos);
  (this->super_FxRandom).super_FxExpression.isresolved = false;
  (this->super_FxRandom).super_FxExpression.NeedResult = true;
  (this->super_FxRandom).super_FxExpression.ExprType = EFX_Random;
  (this->super_FxRandom).EmitTail = false;
  (this->super_FxRandom).min = (FxExpression *)0x0;
  (this->super_FxRandom).max = (FxExpression *)0x0;
  pPVar1 = TypeSInt32;
  (this->super_FxRandom).rng = r;
  (this->super_FxRandom).super_FxExpression.ValueType = (PType *)pPVar1;
  (this->super_FxRandom).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxRandom_0070c4b8;
  pPVar3 = (PType *)TypeFloat64;
  if (mi != (FxExpression *)0x0 && ma != (FxExpression *)0x0) {
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar2->ScriptPosition,&mi->ScriptPosition);
    pFVar2->isresolved = false;
    pFVar2->NeedResult = true;
    pFVar2->ExprType = EFX_FloatCast;
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070b618;
    pFVar2[1]._vptr_FxExpression = (_func_int **)mi;
    pFVar2->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).min = pFVar2;
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x30);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
    FScriptPosition::FScriptPosition(&pFVar2->ScriptPosition,&ma->ScriptPosition);
    pFVar2->isresolved = false;
    pFVar2->NeedResult = true;
    pFVar2->ExprType = EFX_FloatCast;
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxFloatCast_0070b618;
    pFVar2[1]._vptr_FxExpression = (_func_int **)ma;
    pPVar3 = (PType *)TypeFloat64;
    pFVar2->ValueType = (PType *)TypeFloat64;
    (this->super_FxRandom).max = pFVar2;
  }
  (this->super_FxRandom).super_FxExpression.ValueType = pPVar3;
  (this->super_FxRandom).super_FxExpression.ExprType = EFX_FRandom;
  return;
}

Assistant:

FxFRandom::FxFRandom(FRandom *r, FxExpression *mi, FxExpression *ma, const FScriptPosition &pos)
: FxRandom(r, nullptr, nullptr, pos, true)
{
	if (mi != nullptr && ma != nullptr)
	{
		min = new FxFloatCast(mi);
		max = new FxFloatCast(ma);
	}
	ValueType = TypeFloat64;
	ExprType = EFX_FRandom;
}